

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::AddCustomCommandTarget
          (cmLocalNinjaGenerator *this,cmCustomCommand *cc,cmGeneratorTarget *target)

{
  pointer ppVar1;
  __enable_if_t<is_constructible<value_type,_pair<const_cmCustomCommand_*const,_set<cmGeneratorTarget_*>_>_&>::value,_pair<iterator,_bool>_>
  _Var2;
  _Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>
  local_a8;
  pair<std::_Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>,_bool>
  ins;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  local_88;
  undefined1 local_58 [8];
  value_type v;
  cmGeneratorTarget *target_local;
  cmCustomCommand *cc_local;
  cmLocalNinjaGenerator *this_local;
  
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_88._M_t._M_impl._0_8_ = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  v.second._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
  target_local = (cmGeneratorTarget *)cc;
  cc_local = (cmCustomCommand *)this;
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  set(&local_88);
  std::
  pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
  ::
  pair<const_cmCustomCommand_*&,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>,_true>
            ((pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
              *)local_58,(cmCustomCommand **)&target_local,&local_88);
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  ~set(&local_88);
  _Var2 = std::
          map<cmCustomCommand_const*,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>,std::less<cmCustomCommand_const*>,std::allocator<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>>
          ::
          insert<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>&>
                    ((map<cmCustomCommand_const*,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>,std::less<cmCustomCommand_const*>,std::allocator<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>>
                      *)&this->CustomCommandTargets,
                     (pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
                      *)local_58);
  local_a8 = _Var2.first._M_node;
  ins.first._M_node._0_1_ = _Var2.second;
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::push_back
              (&this->CustomCommands,(value_type *)&target_local);
  }
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>
           ::operator->(&local_a8);
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  insert(&ppVar1->second,(value_type *)&v.second._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
  ::~pair((pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
           *)local_58);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AddCustomCommandTarget(cmCustomCommand const* cc,
                                                   cmGeneratorTarget* target)
{
  CustomCommandTargetMap::value_type v(cc, std::set<cmGeneratorTarget*>());
  std::pair<CustomCommandTargetMap::iterator, bool> ins =
    this->CustomCommandTargets.insert(v);
  if (ins.second) {
    this->CustomCommands.push_back(cc);
  }
  ins.first->second.insert(target);
}